

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batch_helper.cxx
# Opt level: O0

bool __thiscall batch_helper::prepare_target_name(batch_helper *this,cl_parser *cl)

{
  bool bVar1;
  xr_file_system *this_00;
  size_t sVar2;
  cl_parser *cl_local;
  batch_helper *this_local;
  
  bVar1 = cl_parser::get_string(cl,"-dir",&this->m_output_folder);
  if (bVar1) {
    bVar1 = xray_re::xr_file_system::folder_exist(&this->m_output_folder);
    if (!bVar1) {
      this_00 = xray_re::xr_file_system::instance();
      bVar1 = xray_re::xr_file_system::create_folder(this_00,&this->m_output_folder);
      if (!bVar1) {
        xray_re::msg("output folder does not exist");
        return false;
      }
    }
    xray_re::xr_file_system::append_path_separator(&this->m_output_folder);
  }
  else {
    bVar1 = cl_parser::get_string(cl,"-out",&this->m_output_file);
    if ((bVar1) && (sVar2 = cl_parser::num_params(cl), 1 < sVar2)) {
      xray_re::msg("explicitly specified output file expects single input file");
      return false;
    }
  }
  return true;
}

Assistant:

bool batch_helper::prepare_target_name(const cl_parser& cl)
{
	if (cl.get_string("-dir", m_output_folder)) {
		if (!xr_file_system::folder_exist(m_output_folder) && !xr_file_system::instance().create_folder(m_output_folder)) {
			msg("output folder does not exist");
			return false;
		}
		xr_file_system::append_path_separator(m_output_folder);
	} else if (cl.get_string("-out", m_output_file)) {
		if (cl.num_params() > 1) {
			msg("explicitly specified output file expects single input file");
			return false;
		}
	}
	return true;
}